

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multistream.h
# Opt level: O2

void __thiscall ipx::Multistream::~Multistream(Multistream *this)

{
  ~Multistream((Multistream *)
               ((long)&(this->super_ostream)._vptr_basic_ostream +
               (long)(this->super_ostream)._vptr_basic_ostream[-3]));
  return;
}

Assistant:

Multistream() : std::ostream(nullptr) {
        std::ostream::rdbuf(&mbuffer_);
    }